

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Operation<duckdb::hugeint_t,int,duckdb::ArgMinMaxState<duckdb::hugeint_t,int>,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
               (ArgMinMaxState<duckdb::hugeint_t,_int> *state,hugeint_t *x,int *y,
               AggregateBinaryInput *binary)

{
  int64_t iVar1;
  bool bVar2;
  AggregateBinaryInput *in_R9;
  hugeint_t x_data;
  
  if ((state->super_ArgMinMaxStateBase).is_initialized != false) {
    x_data.upper._0_4_ = *y;
    x_data.lower = x->upper;
    x_data.upper._4_4_ = 0;
    Execute<duckdb::hugeint_t,int,duckdb::ArgMinMaxState<duckdb::hugeint_t,int>>
              ((ArgMinMaxBase<duckdb::LessThan,false> *)state,
               (ArgMinMaxState<duckdb::hugeint_t,_int> *)x->lower,x_data,(int)binary,in_R9);
    return;
  }
  bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    (&binary->right_mask->super_TemplatedValidityMask<unsigned_long>,binary->ridx);
  if (bVar2) {
    bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&binary->left_mask->super_TemplatedValidityMask<unsigned_long>,binary->lidx);
    (state->super_ArgMinMaxStateBase).arg_null = !bVar2;
    if (bVar2) {
      iVar1 = x->upper;
      (state->arg).lower = x->lower;
      (state->arg).upper = iVar1;
    }
    state->value = *y;
    (state->super_ArgMinMaxStateBase).is_initialized = true;
  }
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}